

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O2

TestCaseGroup * vkt::FragmentOperations::createEarlyFragmentTests(TestContext *testCtx)

{
  undefined4 uVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  TestNode *node;
  long lVar4;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  TestContext *local_88;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  string local_70;
  string local_50;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  local_88 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"early_fragment","early fragment test cases");
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar3;
  if (createEarlyFragmentTests(tcu::TestContext&)::cases == '\0') {
    iVar2 = __cxa_guard_acquire(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)createEarlyFragmentTests::cases,"no_early_fragment_tests_depth",
                 (allocator<char> *)&local_50);
      createEarlyFragmentTests::cases[0].flags = 9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 1),"no_early_fragment_tests_stencil",
                 &local_8f);
      createEarlyFragmentTests::cases[1].flags = 10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 2),"early_fragment_tests_depth",
                 &local_89);
      createEarlyFragmentTests::cases[2].flags = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 3),"early_fragment_tests_stencil",
                 &local_8a);
      createEarlyFragmentTests::cases[3].flags = 2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 4),
                 "no_early_fragment_tests_depth_no_attachment",&local_8b);
      createEarlyFragmentTests::cases[4].flags = 0xd;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 5),
                 "no_early_fragment_tests_stencil_no_attachment",&local_8c);
      createEarlyFragmentTests::cases[5].flags = 0xe;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 6),
                 "early_fragment_tests_depth_no_attachment",&local_8d);
      createEarlyFragmentTests::cases[6].flags = 5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 7),
                 "early_fragment_tests_stencil_no_attachment",&local_8e);
      createEarlyFragmentTests::cases[7].flags = 6;
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    }
  }
  for (lVar4 = 0;
      pTVar3 = testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 0x140; lVar4 = lVar4 + 0x28) {
    node = (TestNode *)operator_new(0x78);
    std::__cxx11::string::string
              ((string *)&local_70,
               (string *)
               ((long)&createEarlyFragmentTests::cases[0].caseName._M_dataplus._M_p + lVar4));
    uVar1 = *(undefined4 *)((long)&createEarlyFragmentTests::cases[0].flags + lVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_8f);
    TestCase::TestCase((TestCase *)node,local_88,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c0b200;
    *(undefined4 *)&node[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
    std::__cxx11::string::~string((string *)&local_70);
  }
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createEarlyFragmentTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "early_fragment", "early fragment test cases"));

	static const struct
	{
		std::string caseName;
		deUint32	flags;
	} cases[] =
	{
		{ "no_early_fragment_tests_depth",					FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "no_early_fragment_tests_stencil",				FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "early_fragment_tests_depth",						FLAG_TEST_DEPTH																			},
		{ "early_fragment_tests_stencil",					FLAG_TEST_STENCIL																		},
		{ "no_early_fragment_tests_depth_no_attachment",	FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "no_early_fragment_tests_stencil_no_attachment",	FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "early_fragment_tests_depth_no_attachment",		FLAG_TEST_DEPTH   |										 FLAG_DONT_USE_TEST_ATTACHMENT  },
		{ "early_fragment_tests_stencil_no_attachment",		FLAG_TEST_STENCIL |										 FLAG_DONT_USE_TEST_ATTACHMENT	},
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(cases); ++i)
		testGroup->addChild(new EarlyFragmentTest(testCtx, cases[i].caseName, cases[i].flags));

	return testGroup.release();
}